

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O0

void __thiscall CScheduler::scheduleFromNow(CScheduler *this,Function *f,milliseconds delta)

{
  CScheduler *this_00;
  function<void_()> *in_RDI;
  long in_FS_OFFSET;
  function<void_()> *in_stack_ffffffffffffff88;
  function<void_()> *in_stack_ffffffffffffff98;
  function<void_()> *f_00;
  time_point t;
  
  t.__d.__r = *(duration *)(in_FS_OFFSET + 0x28);
  f_00 = in_RDI;
  std::function<void_()>::function(in_stack_ffffffffffffff98,in_RDI);
  this_00 = (CScheduler *)std::chrono::_V2::steady_clock::now();
  std::chrono::operator+
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_RDI,(duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff88);
  schedule(this_00,f_00,t);
  std::function<void_()>::~function(in_stack_ffffffffffffff88);
  if ((duration)*(long *)(in_FS_OFFSET + 0x28) == t.__d.__r) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!newTaskMutex)
    {
        schedule(std::move(f), std::chrono::steady_clock::now() + delta);
    }